

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O1

void __thiscall cppcms::impl::url_rewriter::url_rewriter(url_rewriter *this,array *ar)

{
  bool fin;
  ulong uVar1;
  long lVar2;
  long lVar3;
  string p;
  string r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  rule local_78;
  
  (this->rules_).
  super__Vector_base<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rules_).
  super__Vector_base<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rules_).
  super__Vector_base<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>::
  reserve(&this->rules_,*(long *)(ar + 8) - *(long *)ar >> 3);
  lVar2 = *(long *)ar;
  if (*(long *)(ar + 8) != lVar2) {
    lVar3 = 0;
    uVar1 = 0;
    do {
      json::value::get<std::__cxx11::string>(&local_98,(value *)(lVar2 + lVar3),"regex");
      json::value::get<std::__cxx11::string>(&local_b8,(value *)(*(long *)ar + lVar3),"pattern");
      local_78.expression = (regex)0x1;
      fin = json::value::get<bool>((value *)(*(long *)ar + lVar3),"final",(bool *)&local_78);
      rule::rule(&local_78,&local_98,&local_b8,fin);
      std::
      vector<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>::
      emplace_back<cppcms::impl::url_rewriter::rule>(&this->rules_,&local_78);
      if (local_78.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78.pattern);
      booster::regex::~regex(&local_78.expression);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      uVar1 = uVar1 + 1;
      lVar2 = *(long *)ar;
      lVar3 = lVar3 + 8;
    } while (uVar1 < (ulong)(*(long *)(ar + 8) - lVar2 >> 3));
  }
  return;
}

Assistant:

url_rewriter(json::array const &ar)
	{
		rules_.reserve(ar.size());
		for(size_t i=0;i<ar.size();i++) {
			std::string r = ar[i].get<std::string>("regex");
			std::string p = ar[i].get<std::string>("pattern");
			bool final = ar[i].get("final",true);
			rules_.push_back(rule(r,p,final));
		}
	}